

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::draw
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QTransform *viewTransform,QTransform *transformPtr,QRegion *exposedRegion,QWidget *widget,
          qreal opacity,QTransform *effectTransform,bool wasDirtyParentSceneTransform,bool drawItem)

{
  QGraphicsItem *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  QGraphicsItemPrivate *pQVar8;
  QGraphicsItemPrivate *pQVar9;
  const_reference ppQVar10;
  long lVar11;
  qsizetype qVar12;
  QPen *pQVar13;
  QBrush *pQVar14;
  QList<QGraphicsItem_*> *this_00;
  QRegion *in_RCX;
  QPen *in_RDX;
  QStyleOptionGraphicsItem *in_RSI;
  QGraphicsItemPrivate *in_RDI;
  QRegion *in_R9;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined1 auVar17 [16];
  undefined8 in_stack_00000008;
  QRectF *in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  QGraphicsItem *child_1;
  quintptr ptr;
  bool restorePainterClip;
  bool itemClipsToShape;
  QGraphicsItem *child;
  int i;
  bool itemHasChildrenStackedBehind;
  bool setChildClip;
  bool itemHasChildren;
  bool itemClipsChildrenToShape;
  bool itemIsFullyTransparent;
  QList<QGraphicsItem_*> *children;
  undefined6 in_stack_00000098;
  bool in_stack_000000ef;
  QWidget *in_stack_000000f0;
  QStyleOptionGraphicsItem *in_stack_000000f8;
  QPainter *in_stack_00000100;
  QBrush oldBrush;
  QPen oldPen;
  QColor color;
  QTransform *in_stack_00000290;
  QRectF *in_stack_fffffffffffffec8;
  QGraphicsItem *in_stack_fffffffffffffed0;
  QPainter *in_stack_fffffffffffffed8;
  QGraphicsItemPrivate *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  undefined1 allItems;
  QStyleOptionGraphicsItem *option;
  int local_b4;
  qreal in_stack_ffffffffffffffb0;
  QRegion *in_stack_ffffffffffffffb8;
  QTransform *in_stack_ffffffffffffffc0;
  QPainter *in_stack_ffffffffffffffc8;
  QGraphicsItem *in_stack_ffffffffffffffd0;
  QGraphicsScenePrivate *in_stack_ffffffffffffffd8;
  QRegion local_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  allItems = (undefined1)((ulong)in_stack_ffffffffffffff00 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar13 = in_RDX;
  option = in_RSI;
  pQVar8 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&(in_RSI->super_QStyleOption).state);
  bVar4 = QGraphicsItemPrivate::isOpacityNull((qreal)CONCAT44(in_XMM0_Db,in_XMM0_Da));
  pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&(in_RSI->super_QStyleOption).state);
  bVar15 = (*(ulong *)&pQVar9->field_0x160 & 0x1000000000) != 0;
  bVar5 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d79b3);
  bVar6 = (bVar5 ^ 0xffU) & 1;
  bVar5 = false;
  local_b4 = 0;
  bVar3 = bVar15;
  if (bVar6 != 0) {
    if (bVar15) {
      setWorldTransform(in_stack_fffffffffffffed8,(QTransform *)in_stack_fffffffffffffed0,
                        (QTransform *)in_stack_fffffffffffffec8);
    }
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&(in_RSI->super_QStyleOption).state);
    QGraphicsItemPrivate::ensureSortedChildren(in_stack_fffffffffffffef0);
    ppQVar10 = QList<QGraphicsItem_*>::at
                         ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0,
                          (qsizetype)in_stack_fffffffffffffec8);
    pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&(*ppQVar10)->d_ptr);
    bVar5 = (*(ulong *)&pQVar9->field_0x160 & 0x10000000000) != 0;
    if (bVar5) {
      if (bVar15) {
        setClip((QPainter *)in_stack_fffffffffffffed0,(QGraphicsItem *)in_stack_fffffffffffffec8);
      }
      bVar3 = false;
      local_b4 = 0;
      while( true ) {
        lVar11 = (long)local_b4;
        qVar12 = QList<QGraphicsItem_*>::size(&pQVar8->children);
        if (qVar12 <= lVar11) break;
        ppQVar10 = QList<QGraphicsItem_*>::at
                             ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0,
                              (qsizetype)in_stack_fffffffffffffec8);
        pQVar1 = *ppQVar10;
        if ((in_stack_00000018 & 1) != 0) {
          pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&pQVar1->d_ptr);
          *(ulong *)&pQVar9->field_0x160 =
               *(ulong *)&pQVar9->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
        }
        pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar1->d_ptr);
        if ((*(ulong *)&pQVar9->field_0x160 & 0x10000000000) == 0) break;
        if ((!bVar4) ||
           (pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->(&pQVar1->d_ptr),
           (*(ulong *)&pQVar9->field_0x160 & 0x4000000000) != 0)) {
          in_stack_fffffffffffffec8 = in_stack_00000010;
          drawSubtreeRecursive
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (QWidget *)
                     CONCAT17(wasDirtyParentSceneTransform,CONCAT16(drawItem,in_stack_00000098)),
                     in_stack_ffffffffffffffb0,in_stack_00000290);
        }
        local_b4 = local_b4 + 1;
      }
      allItems = (undefined1)((ulong)lVar11 >> 0x38);
    }
  }
  auVar17._8_8_ = in_stack_ffffffffffffffc8;
  auVar17._0_8_ = in_stack_ffffffffffffffc0;
  if ((in_stack_00000020 & 1) != 0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )&(in_RSI->super_QStyleOption).state);
    if (in_R9 == (QRegion *)0x0) {
      QRegion::QRegion(&local_20);
    }
    else {
      QRegion::QRegion(&local_20,in_R9);
    }
    QGraphicsItemPrivate::initStyleOption(in_RDI,option,(QTransform *)pQVar13,in_RCX,(bool)allItems)
    ;
    QRegion::~QRegion(&local_20);
    pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&(in_RSI->super_QStyleOption).state);
    bVar16 = (*(ulong *)&pQVar9->field_0x160 & 0x800000000) != 0;
    bVar2 = false;
    if ((bVar6 == 0) || (!bVar15)) {
      setWorldTransform(in_stack_fffffffffffffed8,(QTransform *)in_stack_fffffffffffffed0,
                        (QTransform *)in_stack_fffffffffffffec8);
      bVar2 = bVar16;
      if (bVar16) {
        setClip((QPainter *)in_stack_fffffffffffffed0,(QGraphicsItem *)in_stack_fffffffffffffec8);
      }
    }
    else if (bVar5) {
      if (bVar16) {
        setWorldTransform(in_stack_fffffffffffffed8,(QTransform *)in_stack_fffffffffffffed0,
                          (QTransform *)in_stack_fffffffffffffec8);
      }
      else {
        QPainter::restore();
        bVar3 = true;
      }
    }
    else if (bVar16) {
      setClip((QPainter *)in_stack_fffffffffffffed0,(QGraphicsItem *)in_stack_fffffffffffffec8);
      bVar3 = false;
    }
    if (((*(uint *)&in_RDI->graphicsEffect >> 0xe & 1) != 0) && (!bVar2)) {
      QPainter::save();
    }
    QPainter::setOpacity((double)CONCAT44(in_XMM0_Db,in_XMM0_Da));
    pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&(in_RSI->super_QStyleOption).state);
    if (((*(ulong *)&pQVar9->field_0x160 >> 0x15 & 3) == 0) &&
       (pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                               *)&(in_RSI->super_QStyleOption).state),
       (*(ulong *)&pQVar9->field_0x160 >> 0x18 & 1) == 0)) {
      (**(code **)(*(long *)&in_RSI->super_QStyleOption + 0x50))
                (in_RSI,in_RDX,&in_RDI[1].imHints,in_stack_00000008);
    }
    else {
      drawItemHelper(_oldPen,_oldBrush,in_stack_00000100,in_stack_000000f8,in_stack_000000f0,
                     in_stack_000000ef);
    }
    if (((*(uint *)&in_RDI->graphicsEffect >> 0xe & 1) != 0) || (bVar2)) {
      QPainter::restore();
    }
    if ((draw(QGraphicsItem*,QPainter*,QTransform_const*,QTransform_const*,QRegion*,QWidget*,double,QTransform_const*,bool,bool)
         ::drawRect == '\0') &&
       (iVar7 = __cxa_guard_acquire(&draw(QGraphicsItem*,QPainter*,QTransform_const*,QTransform_const*,QRegion*,QWidget*,double,QTransform_const*,bool,bool)
                                     ::drawRect), iVar7 != 0)) {
      draw::drawRect = qEnvironmentVariableIntValue("QT_DRAW_SCENE_ITEM_RECTS",(bool *)0x0);
      __cxa_guard_release(&draw(QGraphicsItem*,QPainter*,QTransform_const*,QTransform_const*,QRegion*,QWidget*,double,QTransform_const*,bool,bool)
                           ::drawRect);
    }
    auVar17._8_8_ = in_stack_ffffffffffffffc8;
    auVar17._0_8_ = in_stack_ffffffffffffffc0;
    if (draw::drawRect != 0) {
      in_stack_ffffffffffffffd0 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffffd8 = (QGraphicsScenePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar13 = (QPen *)QPainter::pen();
      QPen::QPen((QPen *)&stack0xffffffffffffffd8,pQVar13);
      pQVar14 = (QBrush *)QPainter::brush();
      QBrush::QBrush((QBrush *)&stack0xffffffffffffffd0,pQVar14);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      auVar17 = QColor::fromHsv((int)in_RSI + (int)((ulong)in_RSI / 0xff) * -0xff,0xff,0xff,0xff);
      local_18 = auVar17._0_8_;
      puStack_10._0_6_ = auVar17._8_6_;
      QPainter::setPen((QColor *)in_RDX);
      QPainter::setBrush((BrushStyle)in_RDX);
      adjustedItemBoundingRect(in_stack_fffffffffffffed0);
      QPainter::drawRect((QPainter *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      QPainter::setPen(in_RDX);
      QPainter::setBrush((QBrush *)in_RDX);
      QBrush::~QBrush((QBrush *)&stack0xffffffffffffffd0);
      QPen::~QPen((QPen *)&stack0xffffffffffffffd8);
    }
  }
  if (bVar6 != 0) {
    if (bVar3) {
      setClip((QPainter *)in_stack_fffffffffffffed0,(QGraphicsItem *)in_stack_fffffffffffffec8);
    }
    while( true ) {
      this_00 = (QList<QGraphicsItem_*> *)(long)local_b4;
      qVar12 = QList<QGraphicsItem_*>::size(&pQVar8->children);
      if (qVar12 <= (long)this_00) break;
      ppQVar10 = QList<QGraphicsItem_*>::at(this_00,(qsizetype)in_stack_fffffffffffffec8);
      pQVar1 = *ppQVar10;
      if ((in_stack_00000018 & 1) != 0) {
        pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&pQVar1->d_ptr);
        *(ulong *)&pQVar9->field_0x160 =
             *(ulong *)&pQVar9->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
      }
      if ((!bVar4) ||
         (pQVar9 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&pQVar1->d_ptr),
         (*(ulong *)&pQVar9->field_0x160 & 0x4000000000) != 0)) {
        in_stack_fffffffffffffec8 = in_stack_00000010;
        drawSubtreeRecursive
                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,auVar17._8_8_,auVar17._0_8_,
                   in_stack_ffffffffffffffb8,
                   (QWidget *)
                   CONCAT17(wasDirtyParentSceneTransform,CONCAT16(drawItem,in_stack_00000098)),
                   in_stack_ffffffffffffffb0,in_stack_00000290);
      }
      local_b4 = local_b4 + 1;
    }
    if (bVar15) {
      QPainter::restore();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::draw(QGraphicsItem *item, QPainter *painter, const QTransform *const viewTransform,
                                 const QTransform *const transformPtr, QRegion *exposedRegion, QWidget *widget,
                                 qreal opacity, const QTransform *effectTransform,
                                 bool wasDirtyParentSceneTransform, bool drawItem)
{
    const auto &children = item->d_ptr->children;

    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape);
    const bool itemHasChildren = !children.isEmpty();
    bool setChildClip = itemClipsChildrenToShape;
    bool itemHasChildrenStackedBehind = false;

    int i = 0;
    if (itemHasChildren) {
        if (itemClipsChildrenToShape)
            setWorldTransform(painter, transformPtr, effectTransform);

        item->d_ptr->ensureSortedChildren();
        // Items with the 'ItemStacksBehindParent' flag are put in front of the list
        // so all we have to do is to check the first item.
        itemHasChildrenStackedBehind = (children.at(0)->d_ptr->flags
                                        & QGraphicsItem::ItemStacksBehindParent);

        if (itemHasChildrenStackedBehind) {
            if (itemClipsChildrenToShape) {
                setClip(painter, item);
                setChildClip = false;
            }

            // Draw children behind
            for (i = 0; i < children.size(); ++i) {
                QGraphicsItem *child = children.at(i);
                if (wasDirtyParentSceneTransform)
                    child->d_ptr->dirtySceneTransform = 1;
                if (!(child->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent))
                    break;
                if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                    continue;
                drawSubtreeRecursive(child, painter, viewTransform, exposedRegion, widget, opacity, effectTransform);
            }
        }
    }

    // Draw item
    if (drawItem) {
        Q_ASSERT(!itemIsFullyTransparent);
        Q_ASSERT(!(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents));
        Q_ASSERT(transformPtr);
        item->d_ptr->initStyleOption(&styleOptionTmp, *transformPtr, exposedRegion
                                     ? *exposedRegion : QRegion(), exposedRegion == nullptr);

        const bool itemClipsToShape = item->d_ptr->flags & QGraphicsItem::ItemClipsToShape;
        bool restorePainterClip = false;

        if (!itemHasChildren || !itemClipsChildrenToShape) {
            // Item does not have children or clip children to shape.
            setWorldTransform(painter, transformPtr, effectTransform);
            if ((restorePainterClip = itemClipsToShape))
                setClip(painter, item);
        } else if (itemHasChildrenStackedBehind){
            // Item clips children to shape and has children stacked behind, which means
            // the painter is already clipped to the item's shape.
            if (itemClipsToShape) {
                // The clip is already correct. Ensure correct world transform.
                setWorldTransform(painter, transformPtr, effectTransform);
            } else {
                // Remove clip (this also ensures correct world transform).
                painter->restore();
                setChildClip = true;
            }
        } else if (itemClipsToShape) {
            // Item clips children and itself to shape. It does not have hildren stacked
            // behind, which means the clip has not yet been set. We set it now and re-use it
            // for the children.
            setClip(painter, item);
            setChildClip = false;
        }

        if (painterStateProtection && !restorePainterClip)
            painter->save();

        painter->setOpacity(opacity);
        if (!item->d_ptr->cacheMode && !item->d_ptr->isWidget)
            item->paint(painter, &styleOptionTmp, widget);
        else
            drawItemHelper(item, painter, &styleOptionTmp, widget, painterStateProtection);

        if (painterStateProtection || restorePainterClip)
            painter->restore();

        static int drawRect = qEnvironmentVariableIntValue("QT_DRAW_SCENE_ITEM_RECTS");
        if (drawRect) {
            QPen oldPen = painter->pen();
            QBrush oldBrush = painter->brush();
            quintptr ptr = reinterpret_cast<quintptr>(item);
            const QColor color = QColor::fromHsv(ptr % 255, 255, 255);
            painter->setPen(color);
            painter->setBrush(Qt::NoBrush);
            painter->drawRect(adjustedItemBoundingRect(item));
            painter->setPen(oldPen);
            painter->setBrush(oldBrush);
        }
    }

    // Draw children in front
    if (itemHasChildren) {
        if (setChildClip)
            setClip(painter, item);

        for (; i < children.size(); ++i) {
            QGraphicsItem *child = children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            drawSubtreeRecursive(child, painter, viewTransform, exposedRegion, widget, opacity, effectTransform);
        }

        // Restore child clip
        if (itemClipsChildrenToShape)
            painter->restore();
    }
}